

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall
BarrierTest_ArriveAndDropCompletion_Test::TestBody(BarrierTest_ArriveAndDropCompletion_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_158;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  AssertHelper local_110;
  Message local_108 [6];
  exception *e;
  undefined1 auStack_c8 [8];
  TrueWithString gtest_msg;
  undefined1 local_98 [8];
  barrier<counting_completion> barrier;
  counting_completion complation;
  int counter;
  BarrierTest_ArriveAndDropCompletion_Test *this_local;
  
  complation.counter._4_4_ = 0;
  barrier.mtx_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)((long)&complation.counter + 4);
  yamc::barrier<counting_completion>::barrier
            ((barrier<counting_completion> *)local_98,1,
             (counting_completion)barrier.mtx_.super___mutex_base._M_mutex.__data.__list.__next);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_c8 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_c8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_c8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::barrier<counting_completion>::arrive_and_drop((barrier<counting_completion> *)local_98);
    }
  }
  else {
    testing::Message::Message(local_108);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar.message_,
                   "Expected: barrier.arrive_and_drop() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_108);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_c8);
  local_144 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_140,"counter","1",(int *)((long)&complation.counter + 4),&local_144);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  yamc::barrier<counting_completion>::~barrier((barrier<counting_completion> *)local_98);
  return;
}

Assistant:

TEST(BarrierTest, ArriveAndDropCompletion)
{
  int counter = 0;
  counting_completion complation{&counter};
  yamc::barrier<counting_completion> barrier{1, complation};
  EXPECT_NO_THROW(barrier.arrive_and_drop());
  EXPECT_EQ(counter, 1);
}